

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Serializer::AddVarArrayField
          (BP5Serializer *this,FMFieldList *FieldP,int *CountP,char *Name,DataType Type,
          int ElementSize,char *SizeField)

{
  int *CountP_00;
  size_t sVar1;
  size_t sVar2;
  char *__s;
  BP5Serializer *in_RCX;
  int *in_RDX;
  long *in_RSI;
  char *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  char *in_stack_00000008;
  char *TypeWithArray;
  char *TransType;
  undefined8 in_stack_ffffffffffffffb0;
  BP5Serializer *in_stack_ffffffffffffffb8;
  int ElementSize_00;
  char *Name_00;
  
  CountP_00 = (int *)TranslateADIOS2Type2FFS
                               (in_stack_ffffffffffffffb8,
                                (DataType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  sVar1 = strlen((char *)CountP_00);
  sVar2 = strlen(in_stack_00000008);
  __s = (char *)malloc(sVar1 + sVar2 + 8);
  Name_00 = __s;
  sVar1 = strlen((char *)CountP_00);
  sVar2 = strlen(in_stack_00000008);
  snprintf(__s,sVar1 + sVar2 + 8,"%s[%s]",CountP_00,in_stack_00000008);
  ElementSize_00 = (int)((ulong)__s >> 0x20);
  free(CountP_00);
  AddSimpleField(in_RCX,(FMFieldList *)CONCAT44(in_R8D,in_R9D),CountP_00,Name_00,in_RDI,
                 ElementSize_00);
  free(Name_00);
  *(undefined4 *)(*in_RSI + (long)(*in_RDX + -1) * 0x18 + 0x10) = in_R9D;
  return;
}

Assistant:

void BP5Serializer::AddVarArrayField(FMFieldList *FieldP, int *CountP, const char *Name,
                                     const DataType Type, int ElementSize, char *SizeField)
{
    char *TransType = TranslateADIOS2Type2FFS(Type);
    char *TypeWithArray = (char *)malloc(strlen(TransType) + strlen(SizeField) + 8);
    snprintf(TypeWithArray, strlen(TransType) + strlen(SizeField) + 8, "%s[%s]", TransType,
             SizeField);
    free(TransType);
    AddSimpleField(FieldP, CountP, Name, TypeWithArray, sizeof(void *));
    free(TypeWithArray);
    (*FieldP)[*CountP - 1].field_size = ElementSize;
}